

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O2

void __thiscall
kratos::EnumPort::EnumPort
          (EnumPort *this,Generator *m,PortDirection direction,string *name,
          shared_ptr<kratos::Enum> *enum_type)

{
  Port::Port(&this->super_Port,m,direction,name,
             ((enum_type->super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             width_,1,Data,false);
  (this->super_Port).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002bd2e8;
  (this->super_EnumType)._vptr_EnumType = (_func_int **)&DAT_002bd460;
  this->enum_type_ =
       (enum_type->super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  return;
}

Assistant:

EnumPort::EnumPort(kratos::Generator* m, kratos::PortDirection direction, const std::string& name,
                   const std::shared_ptr<Enum>& enum_type)
    : Port(m, direction, name, enum_type->width(), 1, PortType::Data, false),
      enum_type_(enum_type.get()) {}